

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O3

Vertex_handle __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::add_vertex(Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
             *this,Root_vertex_handle global)

{
  size_t *psVar1;
  iterator __position;
  bool bVar2;
  Graph_vertex *pGVar3;
  Vertex_handle address;
  int local_24;
  pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_20;
  
  bVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
          contains_vertex(&this->
                           super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                          ,(Root_vertex_handle)global.vertex);
  if (!bVar2) {
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::resize(&(this->
              super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
              ).skeleton.super_type.m_vertices,
             ((long)*(pointer *)
                     ((long)&(this->
                             super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                             ).skeleton.super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              (long)(this->
                    super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                    ).skeleton.super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) + 1);
    address.vertex =
         (int)((ulong)((long)*(pointer *)
                              ((long)&(this->
                                      super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                                      ).skeleton.super_type.m_vertices.
                                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                      (long)(this->
                            super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                            ).skeleton.super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 6) + -1;
    psVar1 = &(this->
              super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
              ).num_vertices_;
    *psVar1 = *psVar1 + 1;
    pGVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
             operator[](&this->
                         super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                        ,address);
    pGVar3->is_active_ = true;
    pGVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
             operator[](&this->
                         super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                        ,address);
    (pGVar3->id_).vertex = global.vertex;
    local_20.first.vertex = global.vertex;
    local_20.second.vertex = address.vertex;
    std::
    _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Select1st<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
    ::
    _M_insert_unique<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
              ((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Select1st<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle_const,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
                *)&this->addresses,&local_20);
    local_24 = 0;
    __position._M_current =
         (this->
         super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>).
         degree_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (this->
        super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>).
        degree_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&(this->
                  super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                  ).degree_,__position,&local_24);
    }
    else {
      *__position._M_current = 0;
      (this->super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
      ).degree_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    return (Vertex_handle)address.vertex;
  }
  __assert_fail("!this->contains_vertex(global)",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/Skeleton_blocker_sub_complex.h"
                ,0x55,
                "Vertex_handle Gudhi::skeleton_blocker::Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>::add_vertex(Root_vertex_handle) [ComplexType = Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>]"
               );
}

Assistant:

Vertex_handle add_vertex(Root_vertex_handle global) {
    assert(!this->contains_vertex(global));
    Vertex_handle address(boost::add_vertex(this->skeleton));
    this->num_vertices_++;
    (*this)[address].activate();
    (*this)[address].set_id(global);
    addresses.insert(AddressPair(global, address));
    this->degree_.push_back(0);
    return address;
  }